

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_front.c
# Opt level: O0

PaError Pa_OpenDefaultStream
                  (PaStream **stream,int inputChannelCount,int outputChannelCount,
                  PaSampleFormat sampleFormat,double sampleRate,unsigned_long framesPerBuffer,
                  PaStreamCallback *streamCallback,void *userData)

{
  PaDeviceIndex PVar1;
  PaError PVar2;
  PaStreamFlags in_RCX;
  int in_EDX;
  int in_ESI;
  double in_RDI;
  PaStreamCallback *in_XMM0_Qa;
  PaStreamParameters *unaff_retaddr;
  PaStreamParameters *hostApiOutputParametersPtr;
  PaStreamParameters *hostApiInputParametersPtr;
  PaStreamParameters hostApiOutputParameters;
  PaStreamParameters hostApiInputParameters;
  PaError result;
  undefined8 in_stack_ffffffffffffff70;
  PaDeviceIndex device;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  device = (PaDeviceIndex)((ulong)in_stack_ffffffffffffff70 >> 0x20);
  if (0 < in_ESI) {
    PVar1 = Pa_GetDefaultInputDevice();
    if (PVar1 == -1) {
      return -0x2701;
    }
    Pa_GetDeviceInfo(device);
  }
  if (0 < in_EDX) {
    PVar1 = Pa_GetDefaultOutputDevice();
    if (PVar1 == -1) {
      return -0x2701;
    }
    Pa_GetDeviceInfo(device);
  }
  PVar2 = Pa_OpenStream((PaStream **)hostApiOutputParametersPtr,unaff_retaddr,
                        (PaStreamParameters *)
                        CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),in_RDI,
                        CONCAT44(in_ESI,in_EDX),in_RCX,in_XMM0_Qa,
                        (void *)hostApiOutputParameters.sampleFormat);
  return PVar2;
}

Assistant:

PaError Pa_OpenDefaultStream( PaStream** stream,
                              int inputChannelCount,
                              int outputChannelCount,
                              PaSampleFormat sampleFormat,
                              double sampleRate,
                              unsigned long framesPerBuffer,
                              PaStreamCallback *streamCallback,
                              void *userData )
{
    PaError result;
    PaStreamParameters hostApiInputParameters, hostApiOutputParameters;
    PaStreamParameters *hostApiInputParametersPtr, *hostApiOutputParametersPtr;

    PA_LOGAPI_ENTER_PARAMS( "Pa_OpenDefaultStream" );
    PA_LOGAPI(("\tPaStream** stream: 0x%p\n", stream ));
    PA_LOGAPI(("\tint inputChannelCount: %d\n", inputChannelCount ));
    PA_LOGAPI(("\tint outputChannelCount: %d\n", outputChannelCount ));
    PA_LOGAPI(("\tPaSampleFormat sampleFormat: %d\n", sampleFormat ));
    PA_LOGAPI(("\tdouble sampleRate: %g\n", sampleRate ));
    PA_LOGAPI(("\tunsigned long framesPerBuffer: %d\n", framesPerBuffer ));
    PA_LOGAPI(("\tPaStreamCallback *streamCallback: 0x%p\n", streamCallback ));
    PA_LOGAPI(("\tvoid *userData: 0x%p\n", userData ));


    if( inputChannelCount > 0 )
    {
        hostApiInputParameters.device = Pa_GetDefaultInputDevice();
		if( hostApiInputParameters.device == paNoDevice )
			return paDeviceUnavailable;

        hostApiInputParameters.channelCount = inputChannelCount;
        hostApiInputParameters.sampleFormat = sampleFormat;
        /* defaultHighInputLatency is used below instead of
           defaultLowInputLatency because it is more important for the default
           stream to work reliably than it is for it to work with the lowest
           latency.
         */
        hostApiInputParameters.suggestedLatency =
             Pa_GetDeviceInfo( hostApiInputParameters.device )->defaultHighInputLatency;
        hostApiInputParameters.hostApiSpecificStreamInfo = NULL;
        hostApiInputParametersPtr = &hostApiInputParameters;
    }
    else
    {
        hostApiInputParametersPtr = NULL;
    }

    if( outputChannelCount > 0 )
    {
        hostApiOutputParameters.device = Pa_GetDefaultOutputDevice();
		if( hostApiOutputParameters.device == paNoDevice )
			return paDeviceUnavailable;

        hostApiOutputParameters.channelCount = outputChannelCount;
        hostApiOutputParameters.sampleFormat = sampleFormat;
        /* defaultHighOutputLatency is used below instead of
           defaultLowOutputLatency because it is more important for the default
           stream to work reliably than it is for it to work with the lowest
           latency.
         */
        hostApiOutputParameters.suggestedLatency =
             Pa_GetDeviceInfo( hostApiOutputParameters.device )->defaultHighOutputLatency;
        hostApiOutputParameters.hostApiSpecificStreamInfo = NULL;
        hostApiOutputParametersPtr = &hostApiOutputParameters;
    }
    else
    {
        hostApiOutputParametersPtr = NULL;
    }


    result = Pa_OpenStream(
                 stream, hostApiInputParametersPtr, hostApiOutputParametersPtr,
                 sampleRate, framesPerBuffer, paNoFlag, streamCallback, userData );

    PA_LOGAPI(("Pa_OpenDefaultStream returned:\n" ));
    PA_LOGAPI(("\t*(PaStream** stream): 0x%p", *stream ));
    PA_LOGAPI(("\tPaError: %d ( %s )\n", result, Pa_GetErrorText( result ) ));

    return result;
}